

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  StringPiece y;
  StringPiece x;
  size_type sVar1;
  size_type sVar2;
  string local_f0;
  string local_d0;
  size_type local_b0;
  char *local_a8;
  StringPiece local_90;
  StringPiece local_80;
  int local_6c;
  undefined1 local_68 [4];
  int res;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  SymbolEntry *rhs_local;
  SymbolEntry *lhs_local;
  SymbolCompare *this_local;
  
  GetParts((pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)&rhs_parts.second.length_,this,lhs);
  GetParts((pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)local_68,this,rhs);
  sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)local_68);
  local_80 = stringpiece_internal::StringPiece::substr
                       ((StringPiece *)&rhs_parts.second.length_,0,sVar1);
  sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&rhs_parts.second.length_);
  local_90 = stringpiece_internal::StringPiece::substr((StringPiece *)local_68,0,sVar1);
  local_6c = stringpiece_internal::StringPiece::compare(&local_80,local_90);
  if (local_6c == 0) {
    sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&rhs_parts.second.length_);
    sVar2 = stringpiece_internal::StringPiece::size((StringPiece *)local_68);
    if (sVar1 == sVar2) {
      local_b0 = rhs_parts.first.length_;
      local_a8 = rhs_parts.second.ptr_;
      x.length_ = (size_type)lhs_parts.second.ptr_;
      x.ptr_ = (char *)lhs_parts.first.length_;
      y.length_ = (size_type)rhs_parts.second.ptr_;
      y.ptr_ = (char *)rhs_parts.first.length_;
      this_local._7_1_ = stringpiece_internal::operator<(x,y);
    }
    else {
      AsString_abi_cxx11_(&local_d0,this,lhs);
      AsString_abi_cxx11_(&local_f0,this,rhs);
      this_local._7_1_ = std::operator<(&local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  else {
    this_local._7_1_ = local_6c < 0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }